

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

QRegion __thiscall QRegion::united(QRegion *this,QRegion *r)

{
  QRegionPrivate *this_00;
  QRegionPrivate *pQVar1;
  bool bVar2;
  QRegion *in_RDX;
  QRegion *r_00;
  
  this_00 = r->d->qt_rgn;
  r_00 = in_RDX;
  if ((this_00 != (QRegionPrivate *)0x0) && (this_00->numRects != 0)) {
    pQVar1 = in_RDX->d->qt_rgn;
    r_00 = r;
    if (((pQVar1 != (QRegionPrivate *)0x0) &&
        (((pQVar1->numRects != 0 && (r->d != in_RDX->d)) &&
         (bVar2 = QRegionPrivate::contains(this_00,&pQVar1->extents), !bVar2)))) &&
       (bVar2 = QRegionPrivate::contains(in_RDX->d->qt_rgn,&r->d->qt_rgn->extents), r_00 = in_RDX,
       !bVar2)) {
      bVar2 = QRegionPrivate::canAppend(r->d->qt_rgn,in_RDX->d->qt_rgn);
      if (bVar2) {
        this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion(this,r);
        detach(this);
        QRegionPrivate::append(this->d->qt_rgn,in_RDX->d->qt_rgn);
        return (QRegion)(QRegionData *)this;
      }
      bVar2 = QRegionPrivate::canPrepend(r->d->qt_rgn,in_RDX->d->qt_rgn);
      if (bVar2) {
        this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion(this,r);
        detach(this);
        QRegionPrivate::prepend(this->d->qt_rgn,in_RDX->d->qt_rgn);
        return (QRegion)(QRegionData *)this;
      }
      bVar2 = EqualRegion(r->d->qt_rgn,in_RDX->d->qt_rgn);
      r_00 = r;
      if (!bVar2) {
        this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion(this);
        detach(this);
        UnionRegion(r->d->qt_rgn,in_RDX->d->qt_rgn,this->d->qt_rgn);
        return (QRegion)(QRegionData *)this;
      }
    }
  }
  QRegion(this,r_00);
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QRegion::united(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn))
        return r;
    if (isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (d == r.d)
        return *this;

    if (d->qt_rgn->contains(*r.d->qt_rgn)) {
        return *this;
    } else if (r.d->qt_rgn->contains(*d->qt_rgn)) {
        return r;
    } else if (d->qt_rgn->canAppend(r.d->qt_rgn)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->append(r.d->qt_rgn);
        return result;
    } else if (d->qt_rgn->canPrepend(r.d->qt_rgn)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->prepend(r.d->qt_rgn);
        return result;
    } else if (EqualRegion(d->qt_rgn, r.d->qt_rgn)) {
        return *this;
    } else {
        QRegion result;
        result.detach();
        UnionRegion(d->qt_rgn, r.d->qt_rgn, *result.d->qt_rgn);
        return result;
    }
}